

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall
Formula_Constraint::Formula_Constraint(Formula_Constraint *this,Formula_Constraint *proto_formula)

{
  Formula_Constraint *proto_formula_local;
  Formula_Constraint *this_local;
  
  Am_Formula_Advanced::Am_Formula_Advanced(&this->super_Am_Formula_Advanced);
  (this->super_Am_Formula_Advanced).super_Am_Constraint.super_Am_Registered_Type.
  _vptr_Am_Registered_Type = (_func_int **)&PTR_ID_00410418;
  this->type = proto_formula->type;
  this->internal_remove = false;
  this->flags = proto_formula->flags;
  Am_Slot::Am_Slot(&this->context,(Am_Slot_Data *)0x0);
  this->formula = proto_formula->formula;
  this->depends_on = (Dependency *)0x0;
  this->data = proto_formula->data;
  this->prototype = (Formula_Constraint *)0x0;
  this->first_instance = (Formula_Constraint *)0x0;
  this->next_instance = (Formula_Constraint *)0x0;
  if (proto_formula->data != (Am_Wrapper *)0x0) {
    Am_Wrapper::Note_Reference(proto_formula->data);
  }
  return;
}

Assistant:

Formula_Constraint::Formula_Constraint(Formula_Constraint *proto_formula)
    : context(nullptr), formula(proto_formula->formula), type(proto_formula->type),
#ifdef DEBUG
      formula_name(proto_formula->formula_name),
#endif
      flags(proto_formula->flags), data(proto_formula->data), depends_on(nullptr),
      prototype(nullptr), first_instance(nullptr), next_instance(nullptr),
      internal_remove(false)
{
  if (proto_formula->data)
    proto_formula->data->Note_Reference();
}